

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void assign_new_filename(filemgr *file,char *new_filename)

{
  size_t sVar1;
  void *pvVar2;
  char *in_RSI;
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x120));
  if (in_RSI == (char *)0x0) {
    *(undefined8 *)(in_RDI + 0x120) = 0;
  }
  else {
    sVar1 = strlen(in_RSI);
    pvVar2 = malloc(sVar1 + 1);
    *(void **)(in_RDI + 0x120) = pvVar2;
    strcpy(*(char **)(in_RDI + 0x120),in_RSI);
  }
  return;
}

Assistant:

static void assign_new_filename(struct filemgr *file, const char *new_filename)
{
    free(file->new_filename);
    if (new_filename) {
        file->new_filename = (char*)malloc(strlen(new_filename) + 1);
        strcpy(file->new_filename, new_filename);
    } else {
        file->new_filename = NULL;
    }
}